

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall kj::HttpHeaders::takeOwnership(HttpHeaders *this,HttpHeaders *otherHeaders)

{
  RemoveConst<kj::Array<char>_> *pRVar1;
  Array<char> *str;
  Array<char> *params;
  
  pRVar1 = (otherHeaders->ownedStrings).builder.pos;
  for (params = (otherHeaders->ownedStrings).builder.ptr; params != pRVar1; params = params + 1) {
    Vector<kj::Array<char>>::add<kj::Array<char>>
              ((Vector<kj::Array<char>> *)&this->ownedStrings,params);
  }
  ArrayBuilder<kj::Array<char>_>::clear(&(otherHeaders->ownedStrings).builder);
  return;
}

Assistant:

void HttpHeaders::takeOwnership(HttpHeaders&& otherHeaders) {
  for (auto& str: otherHeaders.ownedStrings) {
    ownedStrings.add(kj::mv(str));
  }
  otherHeaders.ownedStrings.clear();
}